

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  float fVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  BBox1f BVar10;
  MemoryMonitorInterface *pMVar11;
  BBox1f BVar12;
  BBox1f BVar13;
  ThreadLocal2 *pTVar14;
  iterator iVar15;
  InstanceArray *pIVar16;
  BBox1f *pBVar17;
  Scene *pSVar18;
  float fVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Vec3fa VVar33;
  undefined8 uVar34;
  vint *pvVar35;
  BBox1f BVar36;
  undefined8 uVar37;
  char cVar38;
  long lVar39;
  long lVar40;
  SetMB *this_00;
  void *pvVar41;
  ulong uVar42;
  float *pfVar43;
  size_t sVar44;
  undefined8 *puVar45;
  runtime_error *prVar46;
  BBox1f *pBVar47;
  uint *puVar48;
  byte bVar49;
  pointer *__ptr;
  ulong uVar50;
  ulong uVar51;
  byte bVar52;
  char *pcVar53;
  ulong uVar54;
  ulong uVar55;
  mvector<PrimRefMB> *prims;
  BuildRecord *in_00;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar75;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  undefined1 auVar77 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar79;
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e08 [16];
  undefined1 local_1df8 [16];
  undefined1 local_1dd8 [16];
  undefined1 local_1dc8 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  LBBox3fa lbbox_1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bd8;
  BBox1f local_1bc8;
  size_t sStack_1bc0;
  size_t sStack_1bb8;
  BBox1f BStack_1bb0;
  BBox1f local_1ba8;
  BBox1f BStack_1ba0;
  size_t sStack_1b98;
  size_t sStack_1b90;
  undefined1 auStack_1b88 [16];
  BBox1f local_1b78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1af8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae8;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  BBox1f local_1aa8;
  BBox1f BStack_1aa0;
  size_t sStack_1a98;
  size_t sStack_1a90;
  undefined1 auStack_1a88 [16];
  BBox1f local_1a78;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  undefined8 local_1878;
  undefined8 uStack_1870;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1868;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1858;
  BBox1f local_1848;
  BBox1f BStack_1840;
  size_t sStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  BBox1f BStack_1820;
  BBox1f local_1818;
  undefined8 local_1808;
  uint uStack_17fc;
  undefined8 local_17f8;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 auStack_17d8 [8];
  undefined1 auStack_17d0 [8];
  LBBox3fa lbbox;
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  undefined1 local_1768 [16];
  BBox1f local_1758 [2];
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar42 = in->depth;
  if ((this->cfg).maxDepth < uVar42) {
    puVar45 = (undefined8 *)__cxa_allocate_exception(0x30);
    lbbox.bounds0.lower.field_0._0_8_ = &lbbox.bounds0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lbbox,"depth limit reached","");
    *puVar45 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar45 + 1) = 1;
    puVar45[2] = puVar45 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar45 + 2),lbbox.bounds0.lower.field_0._0_8_,
               CONCAT71(lbbox.bounds0.lower.field_0._9_7_,lbbox.bounds0.lower.field_0._8_1_) +
               lbbox.bounds0.lower.field_0._0_8_);
    __cxa_throw(puVar45,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar5 = *(undefined8 *)
           &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.lower.field_0;
  uVar20 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.lower.field_0 + 8);
  uVar21 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar22 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  aVar76 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  uVar23 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.upper.field_0;
  uVar24 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.upper.field_0 + 8);
  aVar75 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  aVar71 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar10 = (BBox1f)(in->prims).prims;
  BVar12 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar13 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&lbbox,this,&in->prims);
  local_1718[0].mapping.ofs.field_0._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
  local_1718[0].mapping.num = lbbox.bounds0.upper.field_0._0_8_;
  uVar34 = lbbox.bounds0.lower.field_0._0_8_;
  local_18a8 = uVar5;
  uStack_18a0 = uVar20;
  local_1898 = uVar21;
  uStack_1890 = uVar22;
  local_1888 = aVar76;
  local_1878 = uVar23;
  uStack_1870 = uVar24;
  local_1868 = aVar75;
  local_1858 = aVar71;
  local_1848 = BVar12;
  BStack_1840 = BVar13;
  sStack_1838 = values[0].ref.ptr;
  uStack_1830 = values[0]._8_8_;
  uStack_1828 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1820.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar36 = BStack_1820;
  local_1818 = BVar10;
  local_1808 = lbbox.bounds0.lower.field_0._0_8_;
  local_17f8 = lbbox.bounds0.upper.field_0._0_8_;
  local_1718[0].mapping.scale.field_0._0_8_ = lbbox.bounds1.upper.field_0._0_8_;
  local_1718[0].mapping.scale.field_0._8_8_ = lbbox.bounds1.upper.field_0._8_8_;
  local_17e8 = lbbox.bounds1.lower.field_0._0_8_;
  uStack_17e0 = lbbox.bounds1.lower.field_0._8_8_;
  auStack_17d8 = (undefined1  [8])lbbox.bounds1.upper.field_0._0_8_;
  auStack_17d0 = (undefined1  [8])lbbox.bounds1.upper.field_0._8_8_;
  if ((uVar42 == 1) && (BVar13 != BVar12)) {
    BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1820.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar39 = (long)BVar13 - (long)BVar12;
    if ((ulong)BVar13 < (ulong)BVar12 || lVar39 == 0) {
      auVar58 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar47 = &(*(PrimRefMB **)((long)BVar10 + 0x20))[(long)BVar12].time_range;
      auVar58 = ZEXT816(0xff8000007f800000);
      do {
        auVar72._8_8_ = 0;
        auVar72._0_4_ = pBVar47->lower;
        auVar72._4_4_ = pBVar47->upper;
        auVar60 = vcmpps_avx(auVar58,auVar72,1);
        auVar59 = vinsertps_avx(auVar58,auVar72,0x50);
        auVar58 = vblendps_avx(auVar72,auVar58,2);
        auVar58 = vblendvps_avx(auVar58,auVar59,auVar60);
        pBVar47 = pBVar47 + 10;
        lVar39 = lVar39 + -1;
      } while (lVar39 != 0);
    }
    auVar60 = vmovshdup_avx(auVar58);
    auVar60 = vcmpps_avx(auVar60,ZEXT416((uint)BStack_1820.upper),1);
    auVar58 = vcmpps_avx(ZEXT416((uint)BStack_1820.lower),auVar58,1);
    auVar58 = vorps_avx(auVar58,auVar60);
    bVar49 = auVar58[0] & 1;
  }
  else {
    bVar49 = 0;
  }
  uVar55 = (long)BVar13 - (long)BVar12;
  BStack_1820 = BVar36;
  if (((uVar55 <= (this->cfg).maxLeafSize) &&
      (uStack_17fc = (uint)((uint7)lbbox.bounds0.lower.field_0._9_7_ >> 0x18), uStack_17fc < 2)) &&
     (bVar49 == 0)) {
    local_1b18._0_8_ = uVar55 * 8;
    pTVar14 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar14;
      MutexSys::lock(&pTVar14->mutex);
      if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
             ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar62 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar14->alloc0).end = auVar62._0_8_;
      (pTVar14->alloc0).allocBlockSize = auVar62._8_8_;
      (pTVar14->alloc0).bytesUsed = auVar62._16_8_;
      (pTVar14->alloc0).bytesWasted = auVar62._24_8_;
      (pTVar14->alloc0).ptr = (char *)auVar62._0_8_;
      (pTVar14->alloc0).cur = auVar62._8_8_;
      (pTVar14->alloc0).end = auVar62._16_8_;
      (pTVar14->alloc0).allocBlockSize = auVar62._24_8_;
      auVar62 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar14->alloc1).end = auVar62._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar62._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar62._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar62._24_8_;
        (pTVar14->alloc1).ptr = (char *)auVar62._0_8_;
        (pTVar14->alloc1).cur = auVar62._8_8_;
        (pTVar14->alloc1).end = auVar62._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar62._24_8_;
      }
      else {
        (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar14->alloc1).ptr = (char *)auVar62._0_8_;
        (pTVar14->alloc1).cur = auVar62._8_8_;
        (pTVar14->alloc1).end = auVar62._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar62._24_8_;
        (pTVar14->alloc1).end = auVar62._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar62._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar62._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar62._24_8_;
        (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar14->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      lbbox.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox.bounds0.lower.field_0._8_1_ = 1;
      lbbox_1.bounds0.lower.field_0._0_8_ = pTVar14;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar15._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&lbbox_1);
      }
      else {
        *iVar15._M_current = (ThreadLocal2 *)lbbox_1.bounds0.lower.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (lbbox.bounds0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)lbbox.bounds0.lower.field_0._0_8_);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_1b18._0_8_;
    sVar44 = (alloc.talloc1)->cur;
    uVar42 = (ulong)(-(int)sVar44 & 0xf);
    uVar54 = sVar44 + local_1b18._0_8_ + uVar42;
    (alloc.talloc1)->cur = uVar54;
    if ((alloc.talloc1)->end < uVar54) {
      (alloc.talloc1)->cur = sVar44;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(local_1b18._0_8_ << 2)) {
        pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1b18);
      }
      else {
        lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
        (alloc.talloc1)->ptr = pcVar53;
        sVar44 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar44;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = local_1b18._0_8_;
        if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)local_1b18._0_8_) {
          (alloc.talloc1)->cur = 0;
          lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
          (alloc.talloc1)->ptr = pcVar53;
          sVar44 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar44;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = local_1b18._0_8_;
          if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)local_1b18._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar53 = (char *)0x0;
            goto LAB_01446ec5;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar44;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar42;
      pcVar53 = (alloc.talloc1)->ptr + (uVar54 - local_1b18._0_8_);
    }
LAB_01446ec5:
    uVar42 = 7;
    if (uVar55 < 7) {
      uVar42 = uVar55;
    }
    if (BVar13 == BVar12) {
      aVar76.m128[2] = -INFINITY;
      aVar76._0_8_ = 0xff800000ff800000;
      aVar76.m128[3] = -INFINITY;
      aVar79.m128[2] = INFINITY;
      aVar79._0_8_ = 0x7f8000007f800000;
      aVar79.m128[3] = INFINITY;
      aVar68 = aVar79;
      aVar71 = aVar76;
    }
    else {
      lVar39 = (long)BVar12 * 10;
      aVar68.m128[2] = INFINITY;
      aVar68._0_8_ = 0x7f8000007f800000;
      aVar68.m128[3] = INFINITY;
      aVar71.m128[2] = -INFINITY;
      aVar71._0_8_ = 0xff800000ff800000;
      aVar71.m128[3] = -INFINITY;
      uVar54 = 0;
      aVar76 = aVar71;
      aVar79 = aVar68;
      do {
        pSVar18 = ((this->createLeaf).bvh)->scene;
        values[0].ref.ptr._0_4_ = BStack_1820.lower;
        values[0].ref.ptr._4_4_ = BStack_1820.upper;
        uVar8 = *(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).bounds0.lower
                                 .field_0 + lVar39 * 8 + 0xc);
        uVar9 = *(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).bounds0.upper
                                 .field_0 + lVar39 * 8 + 0xc);
        *(uint *)(pcVar53 + uVar54 * 8) = uVar9;
        *(uint *)(pcVar53 + uVar54 * 8 + 4) = uVar8;
        pIVar16 = (InstanceArray *)(pSVar18->geometries).items[uVar8].ptr;
        if ((*(long *)&(pIVar16->super_Geometry).field_0x58 != 0) ||
           (*(int *)((pIVar16->object_ids).super_RawBufferView.ptr_ofs +
                    (pIVar16->object_ids).super_RawBufferView.stride * (ulong)uVar9) != -1)) {
          InstanceArray::nonlinearBounds
                    (&lbbox,pIVar16,(ulong)uVar9,(BBox1f *)values,
                     &(pIVar16->super_Geometry).time_range,
                     (pIVar16->super_Geometry).fnumTimeSegments);
        }
        auVar30[8] = lbbox.bounds0.lower.field_0._8_1_;
        auVar30._0_8_ = lbbox.bounds0.lower.field_0._0_8_;
        auVar30._9_7_ = lbbox.bounds0.lower.field_0._9_7_;
        aVar79.m128 = (__m128)vminps_avx(aVar79.m128,auVar30);
        auVar31._8_8_ = lbbox.bounds0.upper.field_0._8_8_;
        auVar31._0_8_ = lbbox.bounds0.upper.field_0._0_8_;
        aVar76.m128 = (__m128)vmaxps_avx(aVar76.m128,auVar31);
        auVar32._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
        auVar32._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
        aVar68.m128 = (__m128)vminps_avx(aVar68.m128,auVar32);
        aVar71.m128 = (__m128)vmaxps_avx(aVar71.m128,lbbox.bounds1.upper.field_0);
        uVar54 = uVar54 + 1;
        lVar39 = lVar39 + 10;
      } while (uVar55 != uVar54);
    }
    (__return_storage_ptr__->ref).ptr = uVar42 | (ulong)pcVar53 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar79;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar76;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar68;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar71;
    __return_storage_ptr__->dt = BStack_1820;
    return __return_storage_ptr__;
  }
  lVar39 = 0xbc;
  do {
    *(undefined8 *)(auStack_17d8 + lVar39 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(auStack_17d0 + lVar39 + 4) = 0;
    lVar39 = lVar39 + 0xf0;
  } while (lVar39 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  lbbox.bounds0.lower.field_0._0_8_ = uVar42;
  uVar37 = lbbox.bounds0.lower.field_0._0_8_;
  lbbox.bounds0.upper.field_0._0_8_ = uVar5;
  lbbox.bounds0.upper.field_0._8_8_ = uVar20;
  lbbox.bounds1.lower.field_0._0_8_ = uVar21;
  lbbox.bounds1.lower.field_0._8_8_ = uVar22;
  lbbox.bounds1.upper.field_0 = aVar76;
  local_1788._0_8_ = uVar23;
  local_1788._8_8_ = uVar24;
  local_1778 = aVar75;
  local_1768 = (undefined1  [16])aVar71;
  local_1758[0] = BVar12;
  local_1758[1] = BVar13;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar10;
  lbbox.bounds0.lower.field_0._0_4_ = (undefined4)uVar34;
  lbbox.bounds0.lower.field_0._4_4_ = SUB84(uVar34,4);
  local_1718[0].sah = (float)lbbox.bounds0.lower.field_0._0_4_;
  local_1718[0].dim = lbbox.bounds0.lower.field_0._4_4_;
  local_840 = BVar10;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1dc8._8_4_ = 0x7f800000;
  local_1dc8._0_8_ = 0x7f8000007f800000;
  local_1dc8._12_4_ = 0x7f800000;
  local_1dd8._8_4_ = 0xff800000;
  local_1dd8._0_8_ = 0xff800000ff800000;
  local_1dd8._12_4_ = 0xff800000;
  bVar52 = 0;
  lbbox.bounds0.lower.field_0._0_8_ = uVar37;
  do {
    if (local_848 == 0) {
      uVar55 = 0xffffffffffffffff;
    }
    else {
      uVar55 = 0xffffffffffffffff;
      pBVar47 = local_1758;
      uVar54 = 0;
      uVar50 = 0;
      do {
        uVar51 = (long)pBVar47[1] - (long)*pBVar47;
        if ((((this->cfg).maxLeafSize < uVar51) || (1 < (uint)pBVar47[9].upper)) || (bVar49 != 0)) {
          if (uVar54 < uVar51) {
            uVar55 = uVar50;
            uVar54 = uVar51;
          }
          bVar49 = 0;
        }
        uVar50 = uVar50 + 1;
        pBVar47 = pBVar47 + 0x1e;
      } while (local_848 != uVar50);
    }
    if (uVar55 != 0xffffffffffffffff) {
      lVar39 = uVar55 * 0xf0;
      lbbox_1.bounds0.lower.field_0._0_8_ = uVar42 + 1;
      local_1b18._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
      local_1a68 = 0xffffffff7f800000;
      uStack_1a60 = 0;
      pSVar3 = (Split *)((long)local_1718 + lVar39);
      iVar6 = *(int *)((long)local_1718 + lVar39 + 0xc);
      if (iVar6 == 0) {
        local_1ba8 = local_1758[uVar55 * 0x1e];
        BVar10 = local_1758[uVar55 * 0x1e + 1];
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        left.max_time_range.lower = 0.0;
        left.object_range._begin = 0;
        left.object_range._end = 0;
        left.num_time_segments = 0;
        left.max_num_time_segments = 0;
        auVar73._8_4_ = 0x3f800000;
        auVar73._0_8_ = &DAT_3f8000003f800000;
        auVar73._12_4_ = 0x3f800000;
        uVar5 = vmovlps_avx(auVar73);
        left.max_time_range.upper = (float)uVar5;
        left.time_range.lower = (float)((ulong)uVar5 >> 0x20);
        left.time_range.upper = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        uVar5 = vmovlps_avx(auVar73);
        right.max_time_range.upper = (float)uVar5;
        right.time_range.lower = (float)((ulong)uVar5 >> 0x20);
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar39 + 8);
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar40 = (long)(1 << (*(byte *)((long)local_1718 + lVar39 + 4) & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar40);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar40 + 8);
        isLeft.split = pSVar3;
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        BStack_1ba0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1728[uVar55 * 0x1e] + 0x20),
                                         (size_t)local_1ba8,(size_t)BVar10,(EmptyTy *)local_19d8,
                                         &left,&right,&isLeft,&reduction,&reduction2,0x80,0xc00);
        local_1b78 = local_1728[uVar55 * 0x1e];
        auVar57._8_8_ = 0;
        auVar57._0_4_ = local_1728[uVar55 * 0x1e + -1].lower;
        auVar57._4_4_ = local_1728[uVar55 * 0x1e + -1].upper;
        local_1bc8.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
        local_1bc8.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
        sStack_1bc0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[3],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[2]);
        sStack_1bb8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[1],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[0]);
        BStack_1bb0.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3];
        BStack_1bb0.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2];
        lbbox_1.bounds0.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        lbbox_1.bounds0.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        lbbox_1.bounds1.lower.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        lbbox_1.bounds1.lower.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        lbbox_1.bounds1.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        lbbox_1.bounds1.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        aStack_1bd8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        aStack_1bd8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        sStack_1b98 = left.num_time_segments;
        sStack_1b90 = left.max_num_time_segments;
        auStack_1b88._0_8_ = CONCAT44(left.max_time_range.upper,left.max_time_range.lower);
        auStack_1b88._8_8_ = SUB168(auStack_1b88,8);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = auStack_1b88._8_8_;
        auVar58 = vcmpps_avx(auVar63,auVar57,1);
        auVar60 = vinsertps_avx(auVar57,auVar63,0x50);
        auVar59 = vinsertps_avx(auVar63,auVar57,0x50);
        auVar58 = vblendvps_avx(auVar59,auVar60,auVar58);
        uVar5 = vmovlps_avx(auVar58);
        auStack_1b88._0_8_ = SUB168(auStack_1b88,0);
        auStack_1b88._8_8_ = uVar5;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        aStack_1af8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[3];
        aStack_1af8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[2];
        aStack_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1ae8.m128[1] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[1];
        local_1ae8.m128[0] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[0];
        local_1ae8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[3];
        local_1ae8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[2];
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ab8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ab0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1a98 = right.num_time_segments;
        sStack_1a90 = right.max_num_time_segments;
        auStack_1a88._0_8_ = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
        auStack_1a88._8_8_ = SUB168(auStack_1a88,8);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = auStack_1a88._8_8_;
        auVar58 = vcmpps_avx(auVar64,auVar57,1);
        auVar60 = vinsertps_avx(auVar57,auVar64,0x50);
        auVar59 = vinsertps_avx(auVar64,auVar57,0x50);
        auVar58 = vblendvps_avx(auVar59,auVar60,auVar58);
        uVar5 = vmovlps_avx(auVar58);
        auStack_1a88._0_8_ = SUB168(auStack_1a88,0);
        auStack_1a88._8_8_ = uVar5;
        local_1aa8 = BStack_1ba0;
        BStack_1aa0 = BVar10;
        local_1a78 = local_1b78;
LAB_01445644:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_00 = (SetMB *)((long)&lbbox + lVar39 + 0x10);
        if (iVar6 != 2) {
          if (iVar6 == 1) {
            SetMB::deterministic_order(this_00);
            splitFallback(this,this_00,(SetMB *)&lbbox_1.bounds0.upper,(SetMB *)&local_1b08.field_1)
            ;
          }
          else if (iVar6 == 3) {
            SetMB::deterministic_order(this_00);
            splitByGeometry(this,this_00,(SetMB *)&lbbox_1.bounds0.upper,
                            (SetMB *)&local_1b08.field_1);
          }
          goto LAB_01445644;
        }
        time_range1.lower = *(float *)((long)local_1718 + lVar39 + 8);
        time_range0.lower = local_1728[uVar55 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar55 * 0x1e + -1].upper;
        BVar10 = local_1728[uVar55 * 0x1e];
        time_range0.upper = time_range1.lower;
        local_1b78 = (BBox1f)operator_new(0x28);
        pMVar11 = (this->heuristicTemporalSplit).device;
        BVar12 = local_1758[uVar55 * 0x1e + 1];
        *(MemoryMonitorInterface **)local_1b78 = pMVar11;
        *(undefined1 *)((long)local_1b78 + 8) = 0;
        *(long *)((long)local_1b78 + 0x10) = 0;
        *(long *)((long)local_1b78 + 0x18) = 0;
        *(long *)((long)local_1b78 + 0x20) = 0;
        lVar40 = (long)BVar12 - (long)local_1758[uVar55 * 0x1e];
        if (lVar40 != 0) {
          uVar54 = lVar40 * 0x50;
          (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,uVar54,0);
          if (uVar54 < 0x1c00000) {
            pvVar41 = alignedMalloc(uVar54,0x10);
          }
          else {
            pvVar41 = os_malloc(uVar54,(bool *)((long)local_1b78 + 8));
          }
          *(void **)((long)local_1b78 + 0x20) = pvVar41;
          *(long *)((long)local_1b78 + 0x10) = lVar40;
          *(long *)((long)local_1b78 + 0x18) = lVar40;
        }
        pvVar35 = isLeft.vSplitPos;
        vSplitMask.field_0._0_4_ = BVar10.lower;
        vSplitMask.field_0._4_4_ = BVar10.upper;
        vSplitMask.field_0._8_8_ = &time_range0;
        BVar12 = local_1758[uVar55 * 0x1e];
        BVar13 = local_1758[uVar55 * 0x1e + 1];
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        auVar58._8_4_ = 0x3f800000;
        auVar58._0_8_ = &DAT_3f8000003f800000;
        auVar58._12_4_ = 0x3f800000;
        uVar5 = vmovlps_avx(auVar58);
        right.max_time_range.upper = (float)uVar5;
        right.time_range.lower = (float)((ulong)uVar5 >> 0x20);
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_1b78;
        if ((ulong)((long)BVar13 - (long)BVar12) < 0xc00) {
          isLeft.split = (Split *)BVar12;
          isLeft.vSplitPos = (vint *)BVar13;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar35,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)BVar13;
          vSplitPos.field_0.v[1] = (longlong)BVar12;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar38 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar38 != '\0') {
            prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar46,"task cancelled");
            __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (left.object_range._end - left.object_range._begin !=
            (long)local_1758[uVar55 * 0x1e + 1] - (long)local_1758[uVar55 * 0x1e]) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          left.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                         (*(PrimRefMB **)((long)local_1b78 + 0x20),0,
                          (long)local_1758[uVar55 * 0x1e + 1] - (long)local_1758[uVar55 * 0x1e],
                          0x400,(anon_class_8_1_41ce32a5 *)&right);
        }
        uVar5 = vSplitPos.field_0.v[1];
        auVar59._4_4_ = time_range0.upper;
        auVar59._0_4_ = time_range0.lower;
        auVar59._8_8_ = 0;
        local_1bc8.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
        local_1bc8.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
        sStack_1bc0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[3],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[2]);
        sStack_1bb8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[1],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[0]);
        BStack_1bb0.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3];
        BStack_1bb0.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2];
        sStack_1b98 = left.num_time_segments;
        sStack_1b90 = left.max_num_time_segments;
        lbbox_1.bounds0.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        lbbox_1.bounds0.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        lbbox_1.bounds1.lower.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        lbbox_1.bounds1.lower.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        lbbox_1.bounds1.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        lbbox_1.bounds1.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        aStack_1bd8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        aStack_1bd8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1ba8.lower = (float)(undefined4)left.object_range._begin;
        local_1ba8.upper = (float)left.object_range._begin._4_4_;
        BStack_1ba0.lower = (float)(undefined4)left.object_range._end;
        BStack_1ba0.upper = (float)left.object_range._end._4_4_;
        auVar65._4_4_ = left.max_time_range.upper;
        auVar65._0_4_ = left.max_time_range.lower;
        auVar65._8_8_ = 0;
        auVar69._4_4_ = left.time_range.upper;
        auVar69._0_4_ = left.time_range.lower;
        auVar69._8_8_ = 0;
        auVar58 = vcmpps_avx(auVar69,auVar59,1);
        auVar60 = vinsertps_avx(auVar59,auVar69,0x50);
        auVar59 = vinsertps_avx(auVar69,auVar59,0x50);
        auVar58 = vblendvps_avx(auVar59,auVar60,auVar58);
        auStack_1b88 = vmovlhps_avx(auVar65,auVar58);
        BVar12 = local_1758[uVar55 * 0x1e + 1];
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        auVar60._8_4_ = 0x3f800000;
        auVar60._0_8_ = &DAT_3f8000003f800000;
        auVar60._12_4_ = 0x3f800000;
        vmovlps_avx(auVar60);
        _reduction2 = BVar10;
        if ((ulong)((long)BVar12 - (long)local_1758[uVar55 * 0x1e]) < 0xc00) {
          vSplitPos.field_0.v[0] = (longlong)local_1758[uVar55 * 0x1e];
          vSplitPos.field_0.v[1] = (longlong)BVar12;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar5,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19d8._8_8_ = &reduction2;
          _reduction = (code *)BVar12;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar38 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar38 != '\0') {
            prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar46,"task cancelled");
            __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar40 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = *(unsigned_long *)(local_1758 + uVar55 * 0x1e);
        right.object_range._end = lVar40 + right.object_range._begin;
        if (lVar40 != (long)local_1758[uVar55 * 0x1e + 1] - right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar10 + 0x20),right.object_range._begin,
                          (unsigned_long)local_1758[uVar55 * 0x1e + 1],0x400,
                          (anon_class_8_1_41ce32a6 *)&isLeft);
        }
        auVar61._4_4_ = time_range1.upper;
        auVar61._0_4_ = time_range1.lower;
        auVar61._8_8_ = 0;
        aStack_1af8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[3];
        aStack_1af8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[2];
        local_1ae8.m128[1] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[1];
        local_1ae8.m128[0] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[0];
        local_1ae8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[3];
        local_1ae8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[2];
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ab8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ab0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1a90 = right.max_num_time_segments;
        sStack_1a98 = right.num_time_segments;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        aStack_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1aa8.lower = (float)(undefined4)right.object_range._begin;
        local_1aa8.upper = (float)right.object_range._begin._4_4_;
        BStack_1aa0.lower = (float)(undefined4)right.object_range._end;
        BStack_1aa0.upper = (float)right.object_range._end._4_4_;
        auVar66._4_4_ = right.time_range.upper;
        auVar66._0_4_ = right.time_range.lower;
        auVar66._8_8_ = 0;
        auVar58 = vcmpps_avx(auVar66,auVar61,1);
        auVar60 = vinsertps_avx(auVar61,auVar66,0x50);
        auVar59 = vinsertps_avx(auVar66,auVar61,0x50);
        auVar58 = vblendvps_avx(auVar59,auVar60,auVar58);
        auVar67._4_4_ = right.max_time_range.upper;
        auVar67._0_4_ = right.max_time_range.lower;
        auVar67._8_8_ = 0;
        auStack_1a88 = vmovlhps_avx(auVar67,auVar58);
        local_1a78 = BVar10;
      }
      auVar58 = auStack_1b88;
      bVar56 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&left,this,(SetMB *)&lbbox_1.bounds0.upper);
      uVar5 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_;
      uVar20 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
               _8_8_;
      uVar21 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
               _0_8_;
      uVar22 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
               _0_8_;
      uVar23 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
               _8_8_;
      uVar24 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
               _0_8_;
      uVar34 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
               _8_8_;
      findFallback((Split *)&left,this,(SetMB *)&local_1b08.field_1);
      lVar40 = local_640;
      local_1a68 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_;
      uStack_1a60 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._8_8_;
      local_1a58 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      local_1a48 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                   field_0._0_8_;
      uStack_1a40 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._8_8_;
      uStack_1a38 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._0_8_;
      uStack_1a30 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar47 = local_8c8[uVar55];
      if (local_1b78 == *pBVar47) {
        pBVar47[1] = (BBox1f)((long)pBVar47[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar40 * 2 + -1] = local_1b78;
        local_838[lVar40 * 2].lower = 1.4013e-45;
        local_838[lVar40 * 2].upper = 0.0;
        local_8c8[uVar55] = local_838 + lVar40 * 2 + -1;
      }
      lVar40 = local_640;
      if (local_1a78 == *pBVar47) {
        local_8c8[local_848] = pBVar47;
        pBVar47[1] = (BBox1f)((long)pBVar47[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar40 * 2 + -1] = local_1a78;
        local_838[lVar40 * 2].lower = 1.4013e-45;
        local_838[lVar40 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar40 * 2 + -1;
      }
      pBVar17 = pBVar47 + 1;
      *pBVar17 = (BBox1f)((long)*pBVar17 + -1);
      if ((*pBVar17 == (BBox1f)0x0) && (BVar10 = *pBVar47, BVar10 != (BBox1f)0x0)) {
        lVar40 = *(undefined8 *)((long)BVar10 + 0x18);
        pvVar41 = *(void **)((long)BVar10 + 0x20);
        if (pvVar41 != (void *)0x0) {
          if ((ulong)(lVar40 * 0x50) < 0x1c00000) {
            alignedFree(pvVar41);
          }
          else {
            os_free(pvVar41,lVar40 * 0x50,*(bool *)((long)BVar10 + 8));
          }
        }
        if (lVar40 != 0) {
          (**(code **)**(undefined8 **)BVar10)(*(undefined8 **)BVar10,lVar40 * -0x50,1);
        }
        *(undefined8 *)((long)BVar10 + 0x10) = 0;
        *(undefined8 *)((long)BVar10 + 0x18) = 0;
        *(undefined8 *)((long)BVar10 + 0x20) = 0;
        operator_delete((void *)BVar10);
      }
      uVar54 = local_848;
      auVar60 = auStack_1a88;
      VVar33.field_0 =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
      *(undefined8 *)((long)&lbbox + lVar39) = lbbox_1.bounds0.lower.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x10) = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x18) = lbbox_1.bounds0.upper.field_0._8_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x20) = lbbox_1.bounds1.lower.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x28) = lbbox_1.bounds1.lower.field_0._8_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x30) = lbbox_1.bounds1.upper.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x38) = lbbox_1.bounds1.upper.field_0._8_8_;
      ((BBox1f *)(local_1788 + uVar55 * 0xf0))->lower = (float)aStack_1bd8._0_4_;
      ((BBox1f *)(local_1788 + uVar55 * 0xf0))->upper = aStack_1bd8.m128[1];
      ((BBox1f *)(local_1788 + lVar39 + 8))->lower = (float)aStack_1bd8._8_4_;
      ((BBox1f *)(local_1788 + lVar39 + 8))->upper = aStack_1bd8.m128[3];
      *(BBox1f *)(&local_1778 + uVar55 * 0xf) = local_1bc8;
      *(size_t *)((long)&local_1778 + lVar39 + 8) = sStack_1bc0;
      *(size_t *)(local_1768 + uVar55 * 0xf0) = sStack_1bb8;
      *(BBox1f *)(local_1768 + lVar39 + 8) = BStack_1bb0;
      local_1758[uVar55 * 0x1e] = local_1ba8;
      local_1758[uVar55 * 0x1e + 1] = BStack_1ba0;
      asStack_1748[uVar55 * 0x1e] = sStack_1b98;
      asStack_1748[uVar55 * 0x1e + 1] = sStack_1b90;
      (&local_1738)[uVar55 * 0x1e].lower = (float)auStack_1b88._0_4_;
      (&local_1738)[uVar55 * 0x1e].upper = (float)auStack_1b88._4_4_;
      local_1728[uVar55 * 0x1e + -1].lower = (float)auStack_1b88._8_4_;
      local_1728[uVar55 * 0x1e + -1].upper = (float)auStack_1b88._12_4_;
      *(BBox1f *)&local_1728[uVar55 * 0x1e].lower = local_1b78;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           (undefined4)uVar5;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           SUB84(uVar5,4);
      pSVar3->sah = (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                           lower.field_0._0_4_;
      pSVar3->dim = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._4_4_;
      *(undefined8 *)((long)local_1718 + lVar39 + 8) = uVar20;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x10) = uVar21;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x20) = uVar22;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x28) = uVar23;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x30) = uVar24;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x38) = uVar34;
      lVar39 = local_848 * 0xf0;
      *(undefined8 *)((long)&lbbox + lVar39) = local_1b18._0_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x10) = local_1b08._0_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x18) = local_1b08._8_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x20) = aStack_1af8._0_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x28) = aStack_1af8._8_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x30) = local_1ae8._0_8_;
      *(undefined8 *)((long)&lbbox + lVar39 + 0x38) = local_1ae8._8_8_;
      *(undefined8 *)(local_1788 + uVar54 * 0xf0) = uStack_1ad8;
      *(undefined8 *)(local_1788 + lVar39 + 8) = uStack_1ad0;
      *(undefined8 *)(&local_1778 + uVar54 * 0xf) = local_1ac8;
      *(undefined8 *)((long)&local_1778 + lVar39 + 8) = uStack_1ac0;
      *(undefined8 *)(local_1768 + uVar54 * 0xf0) = uStack_1ab8;
      *(undefined8 *)(local_1768 + lVar39 + 8) = uStack_1ab0;
      local_1758[uVar54 * 0x1e] = local_1aa8;
      local_1758[uVar54 * 0x1e + 1] = BStack_1aa0;
      asStack_1748[uVar54 * 0x1e] = sStack_1a98;
      asStack_1748[uVar54 * 0x1e + 1] = sStack_1a90;
      (&local_1738)[uVar54 * 0x1e].lower = (float)auStack_1a88._0_4_;
      (&local_1738)[uVar54 * 0x1e].upper = (float)auStack_1a88._4_4_;
      local_1728[uVar54 * 0x1e + -1].lower = (float)auStack_1a88._8_4_;
      local_1728[uVar54 * 0x1e + -1].upper = (float)auStack_1a88._12_4_;
      local_1728[uVar54 * 0x1e] = local_1a78;
      *(undefined8 *)((long)local_1718 + lVar39) = local_1a68;
      *(undefined8 *)((long)local_1718 + lVar39 + 8) = uStack_1a60;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x10) = local_1a58;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x20) = local_1a48;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x28) = uStack_1a40;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x30) = uStack_1a38;
      *(undefined8 *)((long)local_1718 + lVar39 + 0x38) = uStack_1a30;
      local_848 = local_848 + 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
           VVar33.field_0;
      auStack_1a88 = auVar60;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar52 = bVar52 | bVar56;
      auStack_1b88 = auVar58;
    }
  } while ((uVar55 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    puVar48 = &uStack_172c;
    uVar42 = local_848;
    do {
      auVar58 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar48[-1]),1);
      auVar60 = vcmpps_avx(ZEXT416(*puVar48),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar58 = vorps_avx(auVar58,auVar60);
      bVar52 = bVar52 | auVar58[0];
      puVar48 = puVar48 + 0x3c;
      uVar42 = uVar42 - 1;
    } while (uVar42 != 0);
  }
  if ((bVar52 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar14 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
      local_1b18._8_1_ = 1;
      local_1b18._0_8_ = pTVar14;
      MutexSys::lock(&pTVar14->mutex);
      if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
             ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar62 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar14->alloc0).end = auVar62._0_8_;
      (pTVar14->alloc0).allocBlockSize = auVar62._8_8_;
      (pTVar14->alloc0).bytesUsed = auVar62._16_8_;
      (pTVar14->alloc0).bytesWasted = auVar62._24_8_;
      (pTVar14->alloc0).ptr = (char *)auVar62._0_8_;
      (pTVar14->alloc0).cur = auVar62._8_8_;
      (pTVar14->alloc0).end = auVar62._16_8_;
      (pTVar14->alloc0).allocBlockSize = auVar62._24_8_;
      auVar62 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar14->alloc1).end = auVar62._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar62._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar62._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar62._24_8_;
        (pTVar14->alloc1).ptr = (char *)auVar62._0_8_;
        (pTVar14->alloc1).cur = auVar62._8_8_;
        (pTVar14->alloc1).end = auVar62._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar62._24_8_;
      }
      else {
        (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar14->alloc1).ptr = (char *)auVar62._0_8_;
        (pTVar14->alloc1).cur = auVar62._8_8_;
        (pTVar14->alloc1).end = auVar62._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar62._24_8_;
        (pTVar14->alloc1).end = auVar62._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar62._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar62._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar62._24_8_;
        (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar14->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar14;
      lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox_1.bounds0.lower.field_0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar15._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&left);
      }
      else {
        *iVar15._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (lbbox_1.bounds0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)lbbox_1.bounds0.lower.field_0._0_8_);
      }
      if (local_1b18._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_1b18._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar44 = (alloc.talloc0)->cur;
    uVar42 = (ulong)(-(int)sVar44 & 0xf);
    uVar55 = sVar44 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar42;
    (alloc.talloc0)->cur = uVar55;
    if ((alloc.talloc0)->end < uVar55) {
      (alloc.talloc0)->cur = sVar44;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar53;
        sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar44;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
          (alloc.talloc0)->ptr = pcVar53;
          sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar44;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar53 = (char *)0x0;
            goto LAB_01446729;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar44;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar42;
      pcVar53 = (alloc.talloc0)->ptr +
                (uVar55 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_01446729:
    uVar42 = 1;
    goto LAB_0144672e;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar14 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
    local_1b18._8_1_ = 1;
    local_1b18._0_8_ = pTVar14;
    MutexSys::lock(&pTVar14->mutex);
    if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
           ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar62 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar14->alloc0).end = auVar62._0_8_;
    (pTVar14->alloc0).allocBlockSize = auVar62._8_8_;
    (pTVar14->alloc0).bytesUsed = auVar62._16_8_;
    (pTVar14->alloc0).bytesWasted = auVar62._24_8_;
    (pTVar14->alloc0).ptr = (char *)auVar62._0_8_;
    (pTVar14->alloc0).cur = auVar62._8_8_;
    (pTVar14->alloc0).end = auVar62._16_8_;
    (pTVar14->alloc0).allocBlockSize = auVar62._24_8_;
    auVar62 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar14->alloc1).end = auVar62._0_8_;
      (pTVar14->alloc1).allocBlockSize = auVar62._8_8_;
      (pTVar14->alloc1).bytesUsed = auVar62._16_8_;
      (pTVar14->alloc1).bytesWasted = auVar62._24_8_;
      (pTVar14->alloc1).ptr = (char *)auVar62._0_8_;
      (pTVar14->alloc1).cur = auVar62._8_8_;
      (pTVar14->alloc1).end = auVar62._16_8_;
      (pTVar14->alloc1).allocBlockSize = auVar62._24_8_;
    }
    else {
      (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar14->alloc1).ptr = (char *)auVar62._0_8_;
      (pTVar14->alloc1).cur = auVar62._8_8_;
      (pTVar14->alloc1).end = auVar62._16_8_;
      (pTVar14->alloc1).allocBlockSize = auVar62._24_8_;
      (pTVar14->alloc1).end = auVar62._0_8_;
      (pTVar14->alloc1).allocBlockSize = auVar62._8_8_;
      (pTVar14->alloc1).bytesUsed = auVar62._16_8_;
      (pTVar14->alloc1).bytesWasted = auVar62._24_8_;
      (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar14->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar14;
    lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    lbbox_1.bounds0.lower.field_0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar15._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar15._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&left);
    }
    else {
      *iVar15._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (lbbox_1.bounds0.lower.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)lbbox_1.bounds0.lower.field_0._0_8_);
    }
    if (local_1b18._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_1b18._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar44 = (alloc.talloc0)->cur;
  uVar42 = (ulong)(-(int)sVar44 & 0xf);
  uVar55 = sVar44 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar42;
  (alloc.talloc0)->cur = uVar55;
  if ((alloc.talloc0)->end < uVar55) {
    (alloc.talloc0)->cur = sVar44;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
      (alloc.talloc0)->ptr = pcVar53;
      sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar44;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar53 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar53;
        sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar44;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar53 = (char *)0x0;
          goto LAB_01446683;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar44;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar42;
    pcVar53 = (alloc.talloc0)->ptr +
              (uVar55 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_01446683:
  pcVar53[0xe0] = '\0';
  pcVar53[0xe1] = '\0';
  pcVar53[0xe2] = -0x80;
  pcVar53[0xe3] = '\x7f';
  pcVar53[0xe4] = '\0';
  pcVar53[0xe5] = '\0';
  pcVar53[0xe6] = -0x80;
  pcVar53[0xe7] = '\x7f';
  pcVar53[0xe8] = '\0';
  pcVar53[0xe9] = '\0';
  pcVar53[0xea] = -0x80;
  pcVar53[0xeb] = '\x7f';
  pcVar53[0xec] = '\0';
  pcVar53[0xed] = '\0';
  pcVar53[0xee] = -0x80;
  pcVar53[0xef] = '\x7f';
  pcVar53[0xf0] = '\0';
  pcVar53[0xf1] = '\0';
  pcVar53[0xf2] = -0x80;
  pcVar53[0xf3] = -1;
  pcVar53[0xf4] = '\0';
  pcVar53[0xf5] = '\0';
  pcVar53[0xf6] = -0x80;
  pcVar53[0xf7] = -1;
  pcVar53[0xf8] = '\0';
  pcVar53[0xf9] = '\0';
  pcVar53[0xfa] = -0x80;
  pcVar53[0xfb] = -1;
  pcVar53[0xfc] = '\0';
  pcVar53[0xfd] = '\0';
  pcVar53[0xfe] = -0x80;
  pcVar53[0xff] = -1;
  uVar42 = 6;
LAB_0144672e:
  pcVar53[0x60] = '\0';
  pcVar53[0x61] = '\0';
  pcVar53[0x62] = -0x80;
  pcVar53[99] = '\x7f';
  pcVar53[100] = '\0';
  pcVar53[0x65] = '\0';
  pcVar53[0x66] = -0x80;
  pcVar53[0x67] = '\x7f';
  pcVar53[0x68] = '\0';
  pcVar53[0x69] = '\0';
  pcVar53[0x6a] = -0x80;
  pcVar53[0x6b] = '\x7f';
  pcVar53[0x6c] = '\0';
  pcVar53[0x6d] = '\0';
  pcVar53[0x6e] = -0x80;
  pcVar53[0x6f] = '\x7f';
  pcVar53[0x40] = '\0';
  pcVar53[0x41] = '\0';
  pcVar53[0x42] = -0x80;
  pcVar53[0x43] = '\x7f';
  pcVar53[0x44] = '\0';
  pcVar53[0x45] = '\0';
  pcVar53[0x46] = -0x80;
  pcVar53[0x47] = '\x7f';
  pcVar53[0x48] = '\0';
  pcVar53[0x49] = '\0';
  pcVar53[0x4a] = -0x80;
  pcVar53[0x4b] = '\x7f';
  pcVar53[0x4c] = '\0';
  pcVar53[0x4d] = '\0';
  pcVar53[0x4e] = -0x80;
  pcVar53[0x4f] = '\x7f';
  pcVar53[0x20] = '\0';
  pcVar53[0x21] = '\0';
  pcVar53[0x22] = -0x80;
  pcVar53[0x23] = '\x7f';
  pcVar53[0x24] = '\0';
  pcVar53[0x25] = '\0';
  pcVar53[0x26] = -0x80;
  pcVar53[0x27] = '\x7f';
  pcVar53[0x28] = '\0';
  pcVar53[0x29] = '\0';
  pcVar53[0x2a] = -0x80;
  pcVar53[0x2b] = '\x7f';
  pcVar53[0x2c] = '\0';
  pcVar53[0x2d] = '\0';
  pcVar53[0x2e] = -0x80;
  pcVar53[0x2f] = '\x7f';
  local_1e08._8_4_ = 0xff800000;
  local_1e08._0_8_ = 0xff800000ff800000;
  local_1e08._12_4_ = 0xff800000;
  *(undefined1 (*) [16])(pcVar53 + 0x70) = local_1e08;
  *(undefined1 (*) [16])(pcVar53 + 0x50) = local_1e08;
  *(undefined1 (*) [16])(pcVar53 + 0x30) = local_1e08;
  auVar58 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar53 + 0x80) = ZEXT1632(auVar58);
  *(undefined1 (*) [32])(pcVar53 + 0xa0) = ZEXT1632(auVar58);
  *(undefined1 (*) [32])(pcVar53 + 0xc0) = ZEXT1632(auVar58);
  pcVar53[0] = '\b';
  pcVar53[1] = '\0';
  pcVar53[2] = '\0';
  pcVar53[3] = '\0';
  pcVar53[4] = '\0';
  pcVar53[5] = '\0';
  pcVar53[6] = '\0';
  pcVar53[7] = '\0';
  pcVar53[8] = '\b';
  pcVar53[9] = '\0';
  pcVar53[10] = '\0';
  pcVar53[0xb] = '\0';
  pcVar53[0xc] = '\0';
  pcVar53[0xd] = '\0';
  pcVar53[0xe] = '\0';
  pcVar53[0xf] = '\0';
  pcVar53[0x10] = '\b';
  pcVar53[0x11] = '\0';
  pcVar53[0x12] = '\0';
  pcVar53[0x13] = '\0';
  pcVar53[0x14] = '\0';
  pcVar53[0x15] = '\0';
  pcVar53[0x16] = '\0';
  pcVar53[0x17] = '\0';
  pcVar53[0x18] = '\b';
  pcVar53[0x19] = '\0';
  pcVar53[0x1a] = '\0';
  pcVar53[0x1b] = '\0';
  pcVar53[0x1c] = '\0';
  pcVar53[0x1d] = '\0';
  pcVar53[0x1e] = '\0';
  pcVar53[0x1f] = '\0';
  local_1df8._8_4_ = 0x7f800000;
  local_1df8._0_8_ = 0x7f8000007f800000;
  local_1df8._12_4_ = 0x7f800000;
  in_00 = (BuildRecord *)&lbbox;
  if (local_848 != 0) {
    pBVar47 = &values[0].dt;
    uVar55 = 0;
    local_1df8._8_4_ = 0x7f800000;
    local_1df8._0_8_ = 0x7f8000007f800000;
    local_1df8._12_4_ = 0x7f800000;
    local_1dc8._8_4_ = 0x7f800000;
    local_1dc8._0_8_ = 0x7f8000007f800000;
    local_1dc8._12_4_ = 0x7f800000;
    local_1e08._8_4_ = 0xff800000;
    local_1e08._0_8_ = 0xff800000ff800000;
    local_1e08._12_4_ = 0xff800000;
    local_1dd8._8_4_ = 0xff800000;
    local_1dd8._0_8_ = 0xff800000ff800000;
    local_1dd8._12_4_ = 0xff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&lbbox_1,this,in_00,alloc);
      pBVar47[-10].lower = (float)lbbox_1.bounds0.lower.field_0._0_4_;
      pBVar47[-10].upper = (float)lbbox_1.bounds0.lower.field_0._4_4_;
      auVar26._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
      auVar26._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar47 + -8) = auVar26;
      pBVar47[-6].lower = (float)lbbox_1.bounds1.lower.field_0._0_4_;
      pBVar47[-6].upper = (float)lbbox_1.bounds1.lower.field_0._4_4_;
      pBVar47[-5].lower = (float)lbbox_1.bounds1.lower.field_0._8_4_;
      pBVar47[-5].upper = (float)lbbox_1.bounds1.lower.field_0._12_4_;
      pBVar47[-4].lower = (float)lbbox_1.bounds1.upper.field_0._0_4_;
      pBVar47[-4].upper = (float)lbbox_1.bounds1.upper.field_0._4_4_;
      pBVar47[-3].lower = (float)lbbox_1.bounds1.upper.field_0._8_4_;
      pBVar47[-3].upper = (float)lbbox_1.bounds1.upper.field_0._12_4_;
      pBVar47[-2].lower = (float)aStack_1bd8._0_4_;
      pBVar47[-2].upper = aStack_1bd8.m128[1];
      pBVar47[-1].lower = (float)aStack_1bd8._8_4_;
      pBVar47[-1].upper = aStack_1bd8.m128[3];
      *pBVar47 = local_1bc8;
      local_1e08 = vmaxps_avx(local_1e08,*(undefined1 (*) [16])(pBVar47 + -6));
      local_1dc8 = vminps_avx(local_1dc8,*(undefined1 (*) [16])(pBVar47 + -4));
      local_1df8 = vminps_avx(local_1df8,auVar26);
      local_1dd8 = vmaxps_avx(local_1dd8,*(undefined1 (*) [16])(pBVar47 + -2));
      uVar55 = uVar55 + 1;
      pBVar47 = pBVar47 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar55 < local_848);
  }
  uVar42 = uVar42 | (ulong)pcVar53;
  if (((uint)uVar42 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar54 = (ulong)pcVar53 & 0xfffffffffffffff0;
      pfVar43 = &values[0].dt.upper;
      uVar55 = 0;
      auVar70._8_4_ = 0x7f7fffff;
      auVar70._0_8_ = 0x7f7fffff7f7fffff;
      auVar70._12_4_ = 0x7f7fffff;
      auVar74._8_4_ = 0xff7fffff;
      auVar74._0_8_ = 0xff7fffffff7fffff;
      auVar74._12_4_ = 0xff7fffff;
      auVar77._8_4_ = 0x7fffffff;
      auVar77._0_8_ = 0x7fffffff7fffffff;
      auVar77._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar54 + uVar55 * 8) = *(undefined8 *)(pfVar43 + -0x15);
        fVar4 = ((BBox1f *)(pfVar43 + -1))->lower;
        fVar80 = 1.0 / (*pfVar43 - fVar4);
        fVar19 = -fVar4 * fVar80;
        auVar58 = vshufps_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),0);
        auVar60 = vshufps_avx(ZEXT416((uint)(1.0 - fVar19)),ZEXT416((uint)(1.0 - fVar19)),0);
        auVar88._0_4_ = pfVar43[-9] * auVar58._0_4_ + pfVar43[-0x11] * auVar60._0_4_;
        auVar88._4_4_ = pfVar43[-8] * auVar58._4_4_ + pfVar43[-0x10] * auVar60._4_4_;
        auVar88._8_4_ = pfVar43[-7] * auVar58._8_4_ + pfVar43[-0xf] * auVar60._8_4_;
        auVar88._12_4_ = pfVar43[-6] * auVar58._12_4_ + pfVar43[-0xe] * auVar60._12_4_;
        auVar83._0_4_ = pfVar43[-5] * auVar58._0_4_ + pfVar43[-0xd] * auVar60._0_4_;
        auVar83._4_4_ = pfVar43[-4] * auVar58._4_4_ + pfVar43[-0xc] * auVar60._4_4_;
        auVar83._8_4_ = pfVar43[-3] * auVar58._8_4_ + pfVar43[-0xb] * auVar60._8_4_;
        auVar83._12_4_ = pfVar43[-2] * auVar58._12_4_ + pfVar43[-10] * auVar60._12_4_;
        fVar80 = (1.0 - fVar4) * fVar80;
        auVar58 = vshufps_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),0);
        auVar60 = vshufps_avx(ZEXT416((uint)(1.0 - fVar80)),ZEXT416((uint)(1.0 - fVar80)),0);
        auVar85._0_4_ = pfVar43[-9] * auVar58._0_4_ + pfVar43[-0x11] * auVar60._0_4_;
        auVar85._4_4_ = pfVar43[-8] * auVar58._4_4_ + pfVar43[-0x10] * auVar60._4_4_;
        auVar85._8_4_ = pfVar43[-7] * auVar58._8_4_ + pfVar43[-0xf] * auVar60._8_4_;
        auVar85._12_4_ = pfVar43[-6] * auVar58._12_4_ + pfVar43[-0xe] * auVar60._12_4_;
        auVar81._0_4_ = pfVar43[-5] * auVar58._0_4_ + pfVar43[-0xd] * auVar60._0_4_;
        auVar81._4_4_ = pfVar43[-4] * auVar58._4_4_ + pfVar43[-0xc] * auVar60._4_4_;
        auVar81._8_4_ = pfVar43[-3] * auVar58._8_4_ + pfVar43[-0xb] * auVar60._8_4_;
        auVar81._12_4_ = pfVar43[-2] * auVar58._12_4_ + pfVar43[-10] * auVar60._12_4_;
        auVar72 = vminps_avx(auVar88,auVar70);
        auVar60 = vmaxps_avx(auVar83,auVar74);
        auVar65 = vminps_avx(auVar85,auVar70);
        auVar59 = vmaxps_avx(auVar81,auVar74);
        auVar58 = vandps_avx(auVar72,auVar77);
        auVar86._0_4_ = auVar58._0_4_ * 4.7683716e-07;
        auVar86._4_4_ = auVar58._4_4_ * 4.7683716e-07;
        auVar86._8_4_ = auVar58._8_4_ * 4.7683716e-07;
        auVar86._12_4_ = auVar58._12_4_ * 4.7683716e-07;
        auVar72 = vsubps_avx(auVar72,auVar86);
        auVar58 = vandps_avx(auVar60,auVar77);
        auVar84._0_4_ = auVar60._0_4_ + auVar58._0_4_ * 4.7683716e-07;
        auVar84._4_4_ = auVar60._4_4_ + auVar58._4_4_ * 4.7683716e-07;
        auVar84._8_4_ = auVar60._8_4_ + auVar58._8_4_ * 4.7683716e-07;
        auVar84._12_4_ = auVar60._12_4_ + auVar58._12_4_ * 4.7683716e-07;
        auVar58 = vandps_avx(auVar65,auVar77);
        auVar87._0_4_ = auVar58._0_4_ * 4.7683716e-07;
        auVar87._4_4_ = auVar58._4_4_ * 4.7683716e-07;
        auVar87._8_4_ = auVar58._8_4_ * 4.7683716e-07;
        auVar87._12_4_ = auVar58._12_4_ * 4.7683716e-07;
        auVar60 = vsubps_avx(auVar65,auVar87);
        auVar58 = vandps_avx(auVar59,auVar77);
        *(int *)(uVar54 + 0x20 + uVar55 * 4) = auVar72._0_4_;
        uVar7 = vextractps_avx(auVar72,1);
        *(undefined4 *)(uVar54 + 0x40 + uVar55 * 4) = uVar7;
        auVar82._0_4_ = auVar58._0_4_ * 4.7683716e-07 + auVar59._0_4_;
        auVar82._4_4_ = auVar58._4_4_ * 4.7683716e-07 + auVar59._4_4_;
        auVar82._8_4_ = auVar58._8_4_ * 4.7683716e-07 + auVar59._8_4_;
        auVar82._12_4_ = auVar58._12_4_ * 4.7683716e-07 + auVar59._12_4_;
        uVar7 = vextractps_avx(auVar72,2);
        *(undefined4 *)(uVar54 + 0x60 + uVar55 * 4) = uVar7;
        *(float *)(uVar54 + 0x30 + uVar55 * 4) = auVar84._0_4_;
        uVar7 = vextractps_avx(auVar84,1);
        *(undefined4 *)(uVar54 + 0x50 + uVar55 * 4) = uVar7;
        auVar58 = vsubps_avx(auVar60,auVar72);
        uVar7 = vextractps_avx(auVar84,2);
        *(undefined4 *)(uVar54 + 0x70 + uVar55 * 4) = uVar7;
        *(int *)(uVar54 + 0x80 + uVar55 * 4) = auVar58._0_4_;
        uVar7 = vextractps_avx(auVar58,1);
        *(undefined4 *)(uVar54 + 0xa0 + uVar55 * 4) = uVar7;
        auVar60 = vsubps_avx(auVar82,auVar84);
        uVar7 = vextractps_avx(auVar58,2);
        *(undefined4 *)(uVar54 + 0xc0 + uVar55 * 4) = uVar7;
        *(int *)(uVar54 + 0x90 + uVar55 * 4) = auVar60._0_4_;
        uVar7 = vextractps_avx(auVar60,1);
        *(undefined4 *)(uVar54 + 0xb0 + uVar55 * 4) = uVar7;
        uVar7 = vextractps_avx(auVar60,2);
        *(undefined4 *)(uVar54 + 0xd0 + uVar55 * 4) = uVar7;
        uVar55 = uVar55 + 1;
        pfVar43 = pfVar43 + 0x18;
      } while (local_848 != uVar55);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::avx::RecalculatePrimRef<embree::InstanceArray>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeaf<4,embree::InstanceArray,embree::InstanceArrayPrimitive>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  BVar12 = BStack_1840;
  BVar10 = local_1848;
  if ((bVar52 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar42;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1df8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e08._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1dc8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1dc8._8_8_;
  }
  else {
    vSplitPos.field_0.v[0] = (longlong)&local_18a8;
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    local_1b18.m128[2] = INFINITY;
    local_1b18._0_8_ = 0x7f8000007f800000;
    local_1b18.m128[3] = INFINITY;
    local_1b08.m128[2] = -INFINITY;
    local_1b08._0_8_ = 0xff800000ff800000;
    local_1b08.m128[3] = -INFINITY;
    aStack_1af8.m128 = local_1b18.m128;
    local_1ae8.m128 = local_1b08.m128;
    uVar55 = (long)BStack_1840 - (long)local_1848;
    if (uVar55 < 0xc00) {
      aVar71 = local_1b18;
      aVar76 = local_1b08;
      aVar78 = local_1b18;
      aVar75 = local_1b08;
      if ((ulong)local_1848 < (ulong)BStack_1840) {
        lVar39 = (long)local_1848 * 0x50 + 0x1c;
        aVar75.m128[2] = -INFINITY;
        aVar75._0_8_ = 0xff800000ff800000;
        aVar75.m128[3] = -INFINITY;
        aVar78.m128[2] = INFINITY;
        aVar78._0_8_ = 0x7f8000007f800000;
        aVar78.m128[3] = INFINITY;
        aVar76 = aVar75;
        aVar71 = aVar78;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
             local_1b18;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 =
             local_1b08;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0 =
             local_1b18;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0 =
             local_1b08;
        do {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_4_ = BStack_1820.lower;
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _4_4_ = BStack_1820.upper;
          uVar54 = (ulong)*(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).
                                           bounds0.lower.field_0 + lVar39);
          pIVar16 = *(InstanceArray **)
                     (*(long *)(*(long *)vSplitPos.field_0.v[1] + 0x1e8) +
                     (ulong)*(uint *)((long)*(PrimRefMB **)((long)local_1818 + 0x20) +
                                     lVar39 + -0x10) * 8);
          if ((*(long *)&(pIVar16->super_Geometry).field_0x58 != 0) ||
             (*(int *)((pIVar16->object_ids).super_RawBufferView.ptr_ofs +
                      (pIVar16->object_ids).super_RawBufferView.stride * uVar54) != -1)) {
            InstanceArray::nonlinearBounds
                      (&lbbox_1,pIVar16,uVar54,(BBox1f *)&right,
                       &(pIVar16->super_Geometry).time_range,
                       (pIVar16->super_Geometry).fnumTimeSegments);
          }
          auVar25._8_4_ = lbbox_1.bounds0.lower.field_0.m128[2];
          auVar25._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
          auVar25._12_2_ = lbbox_1.bounds0.lower.field_0._12_2_;
          auVar25._14_2_ = lbbox_1.bounds0.lower.field_0._14_2_;
          aVar71.m128 = (__m128)vminps_avx(aVar71.m128,auVar25);
          auVar27._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
          auVar27._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
          aVar76.m128 = (__m128)vmaxps_avx(aVar76.m128,auVar27);
          auVar28._8_8_ = lbbox_1.bounds1.lower.field_0._8_8_;
          auVar28._0_8_ = lbbox_1.bounds1.lower.field_0._0_8_;
          aVar78.m128 = (__m128)vminps_avx(aVar78.m128,auVar28);
          auVar29._8_8_ = lbbox_1.bounds1.upper.field_0._8_8_;
          auVar29._0_8_ = lbbox_1.bounds1.upper.field_0._0_8_;
          aVar75.m128 = (__m128)vmaxps_avx(aVar75.m128,auVar29);
          lVar39 = lVar39 + 0x50;
          uVar55 = uVar55 - 1;
        } while (uVar55 != 0);
      }
    }
    else {
      lbbox_1.bounds0.lower.field_0._12_2_ = 0x401;
      lbbox_1.bounds1.lower.field_0._0_8_ = 0;
      lbbox_1.bounds1.lower.field_0._8_8_ = 0;
      tbb::detail::r1::initialize((task_group_context *)&lbbox_1);
      BVar36 = BStack_1840;
      BVar13 = local_1848;
      BStack_1840.lower = BVar12.lower;
      BStack_1840.upper = BVar12.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           BStack_1840.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           BStack_1840.upper;
      local_1848.lower = BVar10.lower;
      local_1848.upper = BVar10.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_4_ =
           local_1848.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._12_4_ =
           local_1848.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      local_1848 = BVar13;
      BStack_1840 = BVar36;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)&local_1b18.field_1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&lbbox_1,
                 (task_group_context *)
                 new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl);
      cVar38 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&lbbox_1);
      if (cVar38 != '\0') {
        prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar46,"task cancelled");
        __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&lbbox_1);
      aVar71 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
      aVar76 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0;
      aVar78 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0;
      aVar75 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0;
    }
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0 = aVar75;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0 = aVar78;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 = aVar76;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 = aVar71;
    (__return_storage_ptr__->ref).ptr = uVar42;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    local_1dd8._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_;
    local_1dd8._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dd8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1dd8._8_8_;
  __return_storage_ptr__->dt = BStack_1820;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar42 = 0;
  do {
    pBVar17 = local_8c8[uVar42];
    pBVar47 = pBVar17 + 1;
    *pBVar47 = (BBox1f)((long)*pBVar47 + -1);
    if ((*pBVar47 == (BBox1f)0x0) && (BVar10 = *pBVar17, BVar10 != (BBox1f)0x0)) {
      lVar39 = *(undefined8 *)((long)BVar10 + 0x18);
      pvVar41 = *(void **)((long)BVar10 + 0x20);
      if (pvVar41 != (void *)0x0) {
        if ((ulong)(lVar39 * 0x50) < 0x1c00000) {
          alignedFree(pvVar41);
        }
        else {
          os_free(pvVar41,lVar39 * 0x50,*(bool *)((long)BVar10 + 8));
        }
      }
      if (lVar39 != 0) {
        (**(code **)**(undefined8 **)BVar10)(*(undefined8 **)BVar10,lVar39 * -0x50,1);
      }
      *(undefined8 *)((long)BVar10 + 0x10) = 0;
      *(undefined8 *)((long)BVar10 + 0x18) = 0;
      *(undefined8 *)((long)BVar10 + 0x20) = 0;
      operator_delete((void *)BVar10);
    }
    uVar42 = uVar42 + 1;
  } while (uVar42 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }